

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O0

void __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
::initiate_async_wait::operator()(initiate_async_wait *this,type *handler)

{
  type *in_RDI;
  type *unaff_retaddr;
  implementation_type *in_stack_00000008;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_00000010;
  non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30)_&>
  handler2;
  non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30)_&>
  *in_stack_ffffffffffffffb0;
  type *io_ex;
  
  io_ex = in_RDI;
  asio::detail::
  non_const_lvalue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30)_&>
  ::non_const_lvalue(in_stack_ffffffffffffffb0,in_RDI);
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_service((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                 *)(in_RDI->ptr).
                   super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_implementation
            ((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
              *)(in_RDI->ptr).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr);
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_executor((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                  *)(in_RDI->ptr).
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  asio::detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
  ::
  async_wait<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0,asio::any_io_executor>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(any_io_executor *)io_ex);
  asio::detail::
  non_const_lvalue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30)_&>
  ::~non_const_lvalue((non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30)_&>
                       *)0x5f0242);
  return;
}

Assistant:

void operator()(WaitHandler&& handler) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a WaitHandler.
      ASIO_WAIT_HANDLER_CHECK(WaitHandler, handler) type_check;

      detail::non_const_lvalue<WaitHandler> handler2(handler);
      self_->impl_.get_service().async_wait(
          self_->impl_.get_implementation(),
          handler2.value, self_->impl_.get_executor());
    }